

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buffer_impl.cpp
# Opt level: O0

void mpp_buffer_group_dump(MppBufferGroupImpl *group,char *caller)

{
  list_head *plVar1;
  list_head **local_28;
  MppBufferImpl *n;
  MppBufferImpl *pos;
  char *caller_local;
  MppBufferGroupImpl *group_local;
  
  _mpp_log_l(4,"mpp_buffer","\ndumping buffer group %p id %d from %s\n",(char *)0x0,group,
             (ulong)group->group_id,caller);
  _mpp_log_l(4,"mpp_buffer","mode %s\n",(char *)0x0,mode2str[group->mode]);
  _mpp_log_l(4,"mpp_buffer","type %s\n",(char *)0x0,type2str[group->type]);
  _mpp_log_l(4,"mpp_buffer","limit size %d count %d\n",(char *)0x0,group->limit_size,
             (ulong)(uint)group->limit_count);
  _mpp_log_l(4,"mpp_buffer","used buffer count %d\n",(char *)0x0,(ulong)(uint)group->count_used);
  plVar1 = (group->list_used).next;
  n = (MppBufferImpl *)&plVar1[-0xd].prev;
  plVar1 = plVar1->next;
  while (local_28 = &plVar1[-0xd].prev, &n->list_status != &group->list_used) {
    dump_buffer_info(n);
    n = (MppBufferImpl *)local_28;
    plVar1 = plVar1->next;
  }
  _mpp_log_l(4,"mpp_buffer","unused buffer count %d\n",(char *)0x0,(ulong)(uint)group->count_unused)
  ;
  plVar1 = (group->list_unused).next;
  n = (MppBufferImpl *)&plVar1[-0xd].prev;
  plVar1 = plVar1->next;
  while (local_28 = &plVar1[-0xd].prev, &n->list_status != &group->list_unused) {
    dump_buffer_info(n);
    n = (MppBufferImpl *)local_28;
    plVar1 = plVar1->next;
  }
  if (group->logs != (MppBufLogs *)0x0) {
    buf_logs_dump(group->logs);
  }
  return;
}

Assistant:

void mpp_buffer_group_dump(MppBufferGroupImpl *group, const char *caller)
{
    mpp_log("\ndumping buffer group %p id %d from %s\n", group,
            group->group_id, caller);
    mpp_log("mode %s\n", mode2str[group->mode]);
    mpp_log("type %s\n", type2str[group->type]);
    mpp_log("limit size %d count %d\n", group->limit_size, group->limit_count);

    mpp_log("used buffer count %d\n", group->count_used);

    MppBufferImpl *pos, *n;
    list_for_each_entry_safe(pos, n, &group->list_used, MppBufferImpl, list_status) {
        dump_buffer_info(pos);
    }

    mpp_log("unused buffer count %d\n", group->count_unused);
    list_for_each_entry_safe(pos, n, &group->list_unused, MppBufferImpl, list_status) {
        dump_buffer_info(pos);
    }

    if (group->logs)
        buf_logs_dump(group->logs);
}